

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::GaussianNoise::forward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Tensor m;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_e0;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_c8;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Tensor local_98;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_50;
  
  local_98.v = (float *)(this->super_Node).aux_mem;
  local_98.d.bd = (this->super_Node).dim.bd;
  local_98.d.d._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_98.d.d._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_98.d.d._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_98.d._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  local_98.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TensorTools::RandomizeNormal(0.0,this->stddev,&local_98);
  Tensor::vec(&local_b0,
              *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start);
  Tensor::vec(&local_c8,&local_98);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+
            (&local_50,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
             &local_b0,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_c8);
  Tensor::vec(&local_e0,fx);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
            (&local_e0,&local_50);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98.bs);
  return;
}

Assistant:

void GaussianNoise::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomizeNormal(0, stddev, m);
  fx.vec() = xs[0]->vec() + m.vec();
#endif
}